

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O0

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab,int n_ctx,int n_gpu_layers)

{
  mapped_type pgVar1;
  void *pvVar2;
  FILE *pFVar3;
  int iVar4;
  byte bVar5;
  bool bVar6;
  undefined8 uVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  mapped_type *this;
  long lVar10;
  long lVar11;
  mapped_type *ppgVar12;
  ggml_tensor *pgVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint in_ECX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this_00;
  uint *in_RSI;
  string *in_RDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  size_t bpe;
  mapped_type tensor;
  string name;
  int i_2;
  int32_t ne [2];
  int32_t nelements;
  int32_t ttype;
  int32_t length;
  int32_t n_dims;
  vector<char,_std::allocator<char>_> read_buf;
  bool has_lm_head;
  size_t total_size;
  ggml_tallocr alloc_1;
  ggml_tallocr alloc;
  size_t memory_size;
  int n_elements;
  int n_mem;
  int n_ctx_3;
  int n_layer_2;
  int n_embd_2;
  gpt2_hparams *hparams_3;
  value_type *layer;
  int i_1;
  int n_vocab_2;
  int n_ctx_2;
  int n_layer_1;
  int n_embd_1;
  gpt2_hparams *hparams_2;
  ggml_init_params params;
  size_t n_tensors;
  int n_vocab_1;
  int n_ctx_1;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams_1;
  size_t buffer_size;
  ggml_context **ctx;
  ggml_type wtype;
  uint32_t len;
  int i;
  vector<char,_std::allocator<char>_> buf;
  string word;
  int32_t n_vocab;
  int32_t qntvr;
  gpt2_hparams *hparams;
  uint32_t magic;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined7 in_stack_fffffffffffff1d0;
  char in_stack_fffffffffffff1d7;
  size_type in_stack_fffffffffffff1d8;
  undefined6 in_stack_fffffffffffff1e0;
  undefined1 in_stack_fffffffffffff1e6;
  undefined1 in_stack_fffffffffffff1e7;
  allocator<char> *in_stack_fffffffffffff1f0;
  key_type *in_stack_fffffffffffff1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff200;
  undefined8 in_stack_fffffffffffff208;
  _Self local_958;
  _Self local_950;
  allocator<char> local_941;
  string local_940 [36];
  int local_91c;
  int local_918 [4];
  undefined1 local_908 [4];
  int local_904 [8];
  byte local_8e1;
  long local_8e0;
  undefined1 local_8d8 [32];
  undefined1 local_8b8 [32];
  long local_898;
  int local_88c;
  uint local_888;
  uint local_884;
  uint local_880;
  uint local_87c;
  uint *local_878;
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  reference local_3f0;
  int local_3e8;
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [32];
  uint local_320;
  uint local_31c;
  uint local_318;
  uint local_314;
  uint *local_310;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *local_308;
  undefined8 uStack_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  undefined8 uStack_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  long local_2d0;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint *local_2b8;
  long local_2b0;
  uint *local_2a8;
  int local_2a0;
  undefined1 local_29c [4];
  int local_298;
  allocator<char> local_291 [25];
  string local_278 [32];
  uint local_258;
  uint local_254;
  uint *local_250;
  int local_244;
  int local_240;
  long local_230 [65];
  uint local_24;
  uint *local_18;
  string *local_10;
  byte local_1;
  
  local_24 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar7 = std::__cxx11::string::c_str();
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",uVar7);
  std::ifstream::ifstream(local_230,local_10,_S_bin);
  bVar5 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  pFVar3 = _stderr;
  if ((bVar5 & 1) == 0) {
    std::istream::read((char *)local_230,(long)&local_244);
    pFVar3 = _stderr;
    if (local_244 == 0x67676d6c) {
      local_250 = local_18;
      std::istream::read((char *)local_230,(long)local_18);
      std::istream::read((char *)local_230,(long)(local_250 + 1));
      std::istream::read((char *)local_230,(long)(local_250 + 2));
      std::istream::read((char *)local_230,(long)(local_250 + 3));
      std::istream::read((char *)local_230,(long)(local_250 + 4));
      std::istream::read((char *)local_230,(long)(local_250 + 5));
      local_254 = (int)local_250[5] / 1000;
      printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)*local_250);
      printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)local_250[1]);
      printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)local_250[2]);
      printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)local_250[3]);
      printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)local_250[4]);
      printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)local_250[5]);
      printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)local_254);
      local_250[5] = (int)local_250[5] % 1000;
      local_258 = 0;
      std::istream::read((char *)local_230,(long)&local_258);
      pFVar3 = _stderr;
      if (local_258 == *local_18) {
        std::__cxx11::string::string(local_278);
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff1e7,
                            CONCAT16(in_stack_fffffffffffff1e6,in_stack_fffffffffffff1e0)),
                   in_stack_fffffffffffff1d8,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff1d7,in_stack_fffffffffffff1d0));
        std::allocator<char>::~allocator(local_291);
        for (local_298 = 0; local_298 < (int)local_258; local_298 = local_298 + 1) {
          std::istream::read((char *)local_230,(long)local_29c);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff1e7,
                              CONCAT16(in_stack_fffffffffffff1e6,in_stack_fffffffffffff1e0)),
                     in_stack_fffffffffffff1d8);
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x111864);
          std::istream::read((char *)local_230,(long)pcVar8);
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x11188c);
          std::__cxx11::string::assign((char *)local_278,(ulong)pcVar8);
          iVar4 = local_298;
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
          *pmVar9 = iVar4;
          this = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff200,(key_type *)in_stack_fffffffffffff1f8);
          std::__cxx11::string::operator=((string *)this,local_278);
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff1d7,in_stack_fffffffffffff1d0));
        std::__cxx11::string::~string(local_278);
        local_2a0 = ggml_ftype_to_ggml_type(local_18[5]);
        pFVar3 = _stderr;
        if (local_2a0 == 0x27) {
          uVar7 = std::__cxx11::string::c_str();
          fprintf(pFVar3,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                  uVar7,(ulong)local_18[5]);
          local_1 = 0;
          local_240 = 1;
        }
        else {
          local_2a8 = local_18 + 0x28;
          local_2b0 = 0;
          local_2b8 = local_18;
          local_2bc = local_18[2];
          local_2c0 = local_18[4];
          local_2c4 = local_18[1];
          local_2c8 = *local_18;
          lVar10 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10;
          lVar10 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10;
          lVar10 = ggml_row_size(local_2a0,(long)(int)(local_2c8 * local_2bc));
          local_2b0 = local_2b0 + lVar10;
          lVar10 = ggml_row_size(0,(long)(int)(local_2c4 * local_2bc));
          local_2b0 = local_2b0 + lVar10;
          lVar10 = ggml_row_size(local_2a0,(long)(int)(local_2c8 * local_2bc));
          local_2b0 = local_2b0 + lVar10;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(local_2a0,(long)(int)(local_2bc * local_2bc * 3));
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)(local_2bc * 3));
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(local_2a0,local_2bc * local_2bc);
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)local_2bc);
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(local_2a0,(long)(int)(local_2bc * local_2bc * 4));
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)(local_2bc << 2));
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(local_2a0,(long)(int)(local_2bc * local_2bc * 4));
          local_2b0 = local_2b0 + lVar10 * lVar11;
          lVar10 = (long)(int)local_2c0;
          lVar11 = ggml_row_size(0,(long)(int)(local_2bc << 2));
          local_2b0 = local_2b0 + lVar10 * lVar11 + (long)(int)(local_2c0 * 0x600 + 0x300);
          printf("%s: ggml tensor size    = %d bytes\n","gpt2_model_load",0x150);
          auVar17._8_4_ = (int)((ulong)local_2b0 >> 0x20);
          auVar17._0_8_ = local_2b0;
          auVar17._12_4_ = 0x45300000;
          printf("%s: backend buffer size = %6.2f MB\n",
                 ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2b0) - 4503599627370496.0)) *
                 9.5367431640625e-07,"gpt2_model_load");
          ggml_log_set(ggml_log_callback_default,0);
          local_2d0 = (long)(int)(local_18[4] * 0xc + 8);
          lVar10 = ggml_tensor_overhead();
          this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     *)(lVar10 * local_2d0);
          uStack_2e0 = 0;
          local_2d8 = 1;
          __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(uStack_2d7,1);
          uStack_300 = 0;
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_308 = this_00;
          local_2f8 = __lhs_00;
          uVar7 = ggml_init();
          *(undefined8 *)(local_18 + 0x28) = uVar7;
          if (*(long *)(local_18 + 0x28) == 0) {
            fprintf(_stderr,"%s: ggml_init() failed\n","gpt2_model_load");
            local_1 = 0;
            local_240 = 1;
          }
          else {
            if (*(long *)(local_18 + 0x2a) == 0) {
              fprintf(_stderr,"%s: using CPU backend\n","gpt2_model_load");
              uVar7 = ggml_backend_cpu_init();
              *(undefined8 *)(local_18 + 0x2a) = uVar7;
            }
            if (*(long *)(local_18 + 0x2a) == 0) {
              fprintf(_stderr,"%s: ggml_backend_cpu_init() failed\n","gpt2_model_load");
              local_1 = 0;
              local_240 = 1;
            }
            else {
              uVar7 = ggml_backend_alloc_buffer(*(undefined8 *)(local_18 + 0x2a),local_2b0);
              *(undefined8 *)(local_18 + 0x2c) = uVar7;
              local_310 = local_18;
              local_314 = local_18[2];
              local_318 = local_18[4];
              local_31c = local_18[1];
              local_320 = *local_18;
              std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)
                         CONCAT17(in_stack_fffffffffffff1e7,
                                  CONCAT16(in_stack_fffffffffffff1e6,in_stack_fffffffffffff1e0)),
                         in_stack_fffffffffffff1d8);
              uVar7 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
              *(undefined8 *)(local_18 + 8) = uVar7;
              uVar7 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
              *(undefined8 *)(local_18 + 10) = uVar7;
              uVar7 = ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_314,
                                         (long)(int)local_320);
              *(undefined8 *)(local_18 + 0xc) = uVar7;
              uVar7 = ggml_new_tensor_2d(*(undefined8 *)local_2a8,0,(long)(int)local_314,
                                         (long)(int)local_31c);
              *(undefined8 *)(local_18 + 0xe) = uVar7;
              uVar7 = ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_314,
                                         (long)(int)local_320);
              *(undefined8 *)(local_18 + 0x10) = uVar7;
              pgVar1 = *(mapped_type *)(local_18 + 8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                         in_stack_fffffffffffff1f0);
              ppgVar12 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
              *ppgVar12 = pgVar1;
              std::__cxx11::string::~string(local_340);
              std::allocator<char>::~allocator(&local_341);
              pgVar1 = *(mapped_type *)(local_18 + 10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                         in_stack_fffffffffffff1f0);
              ppgVar12 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
              *ppgVar12 = pgVar1;
              std::__cxx11::string::~string(local_368);
              std::allocator<char>::~allocator(&local_369);
              pgVar1 = *(mapped_type *)(local_18 + 0xc);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                         in_stack_fffffffffffff1f0);
              ppgVar12 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
              *ppgVar12 = pgVar1;
              std::__cxx11::string::~string(local_390);
              std::allocator<char>::~allocator(&local_391);
              pgVar1 = *(mapped_type *)(local_18 + 0xe);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                         in_stack_fffffffffffff1f0);
              ppgVar12 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
              *ppgVar12 = pgVar1;
              std::__cxx11::string::~string(local_3b8);
              std::allocator<char>::~allocator(&local_3b9);
              pgVar1 = *(mapped_type *)(local_18 + 0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                         in_stack_fffffffffffff1f0);
              ppgVar12 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
              *ppgVar12 = pgVar1;
              std::__cxx11::string::~string(local_3e0);
              std::allocator<char>::~allocator(&local_3e1);
              for (local_3e8 = 0; local_3e8 < (int)local_318; local_3e8 = local_3e8 + 1) {
                local_3f0 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                                      ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)
                                       (local_18 + 0x12),(long)local_3e8);
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
                local_3f0->ln_1_g = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
                local_3f0->ln_1_b = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
                local_3f0->ln_2_g = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
                local_3f0->ln_2_b = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_314
                                             ,(long)(int)(local_314 * 3));
                local_3f0->c_attn_attn_w = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)(local_314 * 3));
                local_3f0->c_attn_attn_b = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_314
                                            );
                local_3f0->c_attn_proj_w = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
                local_3f0->c_attn_proj_b = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_314
                                             ,(long)(int)(local_314 << 2));
                local_3f0->c_mlp_fc_w = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)(local_314 << 2))
                ;
                local_3f0->c_mlp_fc_b = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,
                                             (long)(int)(local_314 << 2));
                local_3f0->c_mlp_proj_w = pgVar13;
                pgVar13 = (ggml_tensor *)
                          ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_314);
                local_3f0->c_mlp_proj_b = pgVar13;
                pgVar13 = local_3f0->ln_1_g;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_410);
                std::__cxx11::string::~string(local_430);
                std::__cxx11::string::~string(local_450);
                pgVar13 = local_3f0->ln_1_b;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_470);
                std::__cxx11::string::~string(local_490);
                std::__cxx11::string::~string(local_4b0);
                pgVar13 = local_3f0->ln_2_g;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_4d0);
                std::__cxx11::string::~string(local_4f0);
                std::__cxx11::string::~string(local_510);
                pgVar13 = local_3f0->ln_2_b;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_530);
                std::__cxx11::string::~string(local_550);
                std::__cxx11::string::~string(local_570);
                pgVar13 = local_3f0->c_attn_attn_w;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_590);
                std::__cxx11::string::~string(local_5b0);
                std::__cxx11::string::~string(local_5d0);
                pgVar13 = local_3f0->c_attn_attn_b;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_5f0);
                std::__cxx11::string::~string(local_610);
                std::__cxx11::string::~string(local_630);
                pgVar13 = local_3f0->c_attn_proj_w;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_650);
                std::__cxx11::string::~string(local_670);
                std::__cxx11::string::~string(local_690);
                pgVar13 = local_3f0->c_attn_proj_b;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_6b0);
                std::__cxx11::string::~string(local_6d0);
                std::__cxx11::string::~string(local_6f0);
                pgVar13 = local_3f0->c_mlp_fc_w;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_710);
                std::__cxx11::string::~string(local_730);
                std::__cxx11::string::~string(local_750);
                pgVar13 = local_3f0->c_mlp_fc_b;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_770);
                std::__cxx11::string::~string(local_790);
                std::__cxx11::string::~string(local_7b0);
                pgVar13 = local_3f0->c_mlp_proj_w;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_7d0);
                std::__cxx11::string::~string(local_7f0);
                std::__cxx11::string::~string(local_810);
                pgVar13 = local_3f0->c_mlp_proj_b;
                std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff208 >> 0x20));
                std::operator+((char *)__lhs_00,__lhs);
                std::operator+(__lhs_00,(char *)__lhs);
                ppgVar12 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                *ppgVar12 = pgVar13;
                std::__cxx11::string::~string(local_830);
                std::__cxx11::string::~string(local_850);
                std::__cxx11::string::~string(local_870);
              }
              local_18[1] = local_24;
              local_878 = local_18;
              local_87c = local_18[2];
              local_880 = local_18[4];
              local_884 = local_18[1];
              local_888 = local_880 * local_884;
              local_88c = local_87c * local_888;
              uVar7 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)local_88c);
              *(undefined8 *)(local_18 + 0x18) = uVar7;
              uVar7 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)local_88c);
              *(undefined8 *)(local_18 + 0x1a) = uVar7;
              local_18[0x1c] = 0;
              local_18[0x1d] = local_884;
              std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::resize
                        ((vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> *)
                         CONCAT17(in_stack_fffffffffffff1e7,
                                  CONCAT16(in_stack_fffffffffffff1e6,in_stack_fffffffffffff1e0)),
                         in_stack_fffffffffffff1d8);
              lVar10 = ggml_nbytes(*(undefined8 *)(local_18 + 0x18));
              local_898 = ggml_nbytes(*(undefined8 *)(local_18 + 0x1a));
              local_898 = lVar10 + local_898;
              auVar18._8_4_ = (int)((ulong)local_898 >> 0x20);
              auVar18._0_8_ = local_898;
              auVar18._12_4_ = 0x45300000;
              printf("%s: memory size = %8.2f MB, n_mem = %d\n",
                     ((auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_898) - 4503599627370496.0)) *
                     0.0009765625 * 0.0009765625,"gpt2_model_load",(ulong)local_888);
              uVar7 = ggml_backend_alloc_buffer(*(undefined8 *)(local_18 + 0x2a),local_898 + 0x100);
              *(undefined8 *)(local_18 + 0x26) = uVar7;
              ggml_tallocr_new(local_8b8,*(undefined8 *)(local_18 + 0x26));
              ggml_tallocr_alloc(local_8b8,*(undefined8 *)(local_18 + 0x18));
              ggml_tallocr_alloc(local_8b8,*(undefined8 *)(local_18 + 0x1a));
              ggml_tallocr_new(local_8d8,*(undefined8 *)(local_18 + 0x2c));
              local_8e0 = 0;
              local_8e1 = 0;
              std::vector<char,_std::allocator<char>_>::vector
                        ((vector<char,_std::allocator<char>_> *)0x113dc2);
              do {
                std::istream::read((char *)local_230,(long)local_904);
                std::istream::read((char *)local_230,(long)local_908);
                std::istream::read((char *)local_230,(long)(local_918 + 3));
                bVar5 = std::ios::eof();
                if ((bVar5 & 1) != 0) {
                  auVar19._8_4_ = (int)((ulong)local_8e0 >> 0x20);
                  auVar19._0_8_ = local_8e0;
                  auVar19._12_4_ = 0x45300000;
                  printf("%s: model size  = %8.2f MB\n",
                         ((auVar19._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)local_8e0) - 4503599627370496.0)) *
                         0.0009765625 * 0.0009765625,"gpt2_model_load");
                  local_240 = 0;
                  break;
                }
                local_918[2] = 1;
                local_918[0] = 1;
                local_918[1] = 1;
                for (local_91c = 0; local_91c < local_904[0]; local_91c = local_91c + 1) {
                  std::istream::read((char *)local_230,(long)(local_918 + local_91c));
                  local_918[2] = local_918[local_91c] * local_918[2];
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff1e7,
                                    CONCAT16(in_stack_fffffffffffff1e6,in_stack_fffffffffffff1e0)),
                           in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d7,
                           (allocator<char> *)__lhs_00);
                std::allocator<char>::~allocator(&local_941);
                lVar10 = std::__cxx11::string::operator[]((ulong)local_940);
                std::istream::read((char *)local_230,lVar10);
                local_950._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::find(this_00,(key_type *)0x113f98);
                local_958._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::end(this_00);
                bVar6 = std::operator==(&local_950,&local_958);
                pFVar3 = _stderr;
                if (bVar6) {
                  uVar7 = std::__cxx11::string::c_str();
                  fprintf(pFVar3,"%s: unknown tensor \'%s\' in model file\n","gpt2_model_load",uVar7
                         );
                  local_1 = 0;
                  local_240 = 1;
                }
                else {
                  ppgVar12 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                           *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
                  pgVar1 = *ppgVar12;
                  uVar7 = std::__cxx11::string::c_str();
                  ggml_set_name(pgVar1,uVar7);
                  lVar10 = ggml_nelements(pgVar1);
                  pFVar3 = _stderr;
                  if (lVar10 == local_918[2]) {
                    if ((pgVar1->ne[0] == (long)local_918[0]) &&
                       (pgVar1->ne[1] == (long)local_918[1])) {
                      lVar10 = ggml_type_size(local_918[3]);
                      lVar11 = (long)local_918[2];
                      uVar14 = ggml_blck_size(pgVar1->type);
                      uVar15 = ggml_nbytes(pgVar1);
                      pFVar3 = _stderr;
                      if ((ulong)(lVar11 * lVar10) / uVar14 == uVar15) {
                        ggml_tallocr_alloc(local_8d8,pgVar1);
                        bVar5 = ggml_backend_is_cpu(*(undefined8 *)(local_18 + 0x2a));
                        if ((bVar5 & 1) == 0) {
                          ggml_nbytes(pgVar1);
                          std::vector<char,_std::allocator<char>_>::resize
                                    ((vector<char,_std::allocator<char>_> *)
                                     CONCAT17(in_stack_fffffffffffff1e7,
                                              CONCAT16(in_stack_fffffffffffff1e6,
                                                       in_stack_fffffffffffff1e0)),
                                     in_stack_fffffffffffff1d8);
                          in_stack_fffffffffffff200 =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               std::vector<char,_std::allocator<char>_>::data
                                         ((vector<char,_std::allocator<char>_> *)0x114420);
                          ggml_nbytes(pgVar1);
                          std::istream::read((char *)local_230,(long)in_stack_fffffffffffff200);
                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                             ((vector<char,_std::allocator<char>_> *)0x11446c);
                          in_stack_fffffffffffff1f8 = (key_type *)ggml_nbytes(pgVar1);
                          ggml_backend_tensor_set(pgVar1,pcVar8,0,in_stack_fffffffffffff1f8);
                        }
                        else {
                          pvVar2 = pgVar1->data;
                          ggml_nbytes();
                          std::istream::read((char *)local_230,(long)pvVar2);
                        }
                        in_stack_fffffffffffff1e7 = std::operator==(__lhs,(char *)this_00);
                        if (((bool)in_stack_fffffffffffff1e7) && ((local_8e1 & 1) == 0)) {
                          *(mapped_type *)(local_18 + 0x10) = pgVar1;
                        }
                        in_stack_fffffffffffff1e6 = std::operator==(__lhs,(char *)this_00);
                        if ((bool)in_stack_fffffffffffff1e6) {
                          local_8e1 = 1;
                        }
                        in_stack_fffffffffffff1d8 = ggml_nbytes(pgVar1);
                        local_8e0 = in_stack_fffffffffffff1d8 + local_8e0;
                        local_240 = 0;
                      }
                      else {
                        uVar7 = std::__cxx11::string::c_str();
                        uVar16 = ggml_nbytes(pgVar1);
                        fprintf(pFVar3,
                                "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n"
                                ,"gpt2_model_load",uVar7,uVar16,local_918[2] * lVar10);
                        local_1 = 0;
                        local_240 = 1;
                      }
                    }
                    else {
                      uVar7 = std::__cxx11::string::c_str();
                      this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                 *)CONCAT44((int)((ulong)this_00 >> 0x20),local_918[0]);
                      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44((int)((ulong)__lhs >> 0x20),local_918[1]);
                      fprintf(pFVar3,
                              "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                              ,"gpt2_model_load",uVar7,pgVar1->ne[0] & 0xffffffff,
                              pgVar1->ne[1] & 0xffffffff);
                      local_1 = 0;
                      local_240 = 1;
                    }
                  }
                  else {
                    uVar7 = std::__cxx11::string::c_str();
                    fprintf(pFVar3,"%s: tensor \'%s\' has wrong size in model file\n",
                            "gpt2_model_load",uVar7);
                    local_1 = 0;
                    local_240 = 1;
                  }
                }
                std::__cxx11::string::~string(local_940);
              } while (local_240 == 0);
              std::vector<char,_std::allocator<char>_>::~vector
                        ((vector<char,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff1d7,in_stack_fffffffffffff1d0));
              if (local_240 == 0) {
                std::ifstream::close();
                local_1 = 1;
                local_240 = 1;
              }
            }
          }
        }
      }
      else {
        uVar7 = std::__cxx11::string::c_str();
        fprintf(pFVar3,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load"
                ,uVar7,(ulong)local_258,(ulong)*local_18);
        local_1 = 0;
        local_240 = 1;
      }
    }
    else {
      uVar7 = std::__cxx11::string::c_str();
      fprintf(pFVar3,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",uVar7);
      local_1 = 0;
      local_240 = 1;
    }
  }
  else {
    uVar7 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"%s: failed to open \'%s\'\n","gpt2_model_load",uVar7);
    local_1 = 0;
    local_240 = 1;
  }
  std::ifstream::~ifstream(local_230);
  return (bool)(local_1 & 1);
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab, int n_ctx, int n_gpu_layers) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t buffer_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        buffer_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        buffer_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        buffer_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        buffer_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        buffer_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        buffer_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        buffer_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        buffer_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        buffer_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        buffer_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        buffer_size += (6 + 12*n_layer)*128; // alignment overhead

        printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: backend buffer size = %6.2f MB\n", __func__, buffer_size/(1024.0*1024.0));
    }

    ggml_log_set(ggml_log_callback_default, nullptr);

    // create the ggml context
    {
        size_t n_tensors = 2 + 6 + 12*model.hparams.n_layer;
        struct ggml_init_params params = {
            /*.mem_size   =*/ ggml_tensor_overhead() * n_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (n_gpu_layers > 0) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (n_gpu_layers > 0) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if (!model.backend) {
        // fallback to CPU backend
        fprintf(stderr, "%s: using CPU backend\n", __func__);
        model.backend = ggml_backend_cpu_init();
    }

    if (!model.backend) {
        fprintf(stderr, "%s: ggml_backend_cpu_init() failed\n", __func__);
        return false;
    }

    // allocate weights buffer
    model.buffer_w = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // override the default training context with the user-provided
    model.hparams.n_ctx = n_ctx;

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.kv_cache.k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.kv_cache.v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        model.kv_cache.head      = 0;
        model.kv_cache.size      = n_ctx;

        model.kv_cache.cells.resize(n_ctx);

        const size_t memory_size = ggml_nbytes(model.kv_cache.k) + ggml_nbytes(model.kv_cache.v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);

        // create a backend buffer (can be in host or device memory)
        model.kv_cache.buffer = ggml_backend_alloc_buffer(model.backend, memory_size + 256);

        // allocate the tensors into the backend buffer
        {
            ggml_tallocr alloc = ggml_tallocr_new(model.kv_cache.buffer);

            // this updates the pointers in the tensors to point to the correct location in the buffer
            // this is necessary since the ggml_context is .no_alloc == true
            // note that the buffer can actually be a device buffer, depending on the backend
            ggml_tallocr_alloc(&alloc, model.kv_cache.k);
            ggml_tallocr_alloc(&alloc, model.kv_cache.v);
        }
    }

    // load weights
    {
        ggml_tallocr alloc = ggml_tallocr_new(model.buffer_w);

        size_t total_size = 0;

        bool has_lm_head = false;

        std::vector<char> read_buf;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            ggml_set_name(tensor, name.c_str());
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            ggml_tallocr_alloc(&alloc, tensor);

            if (ggml_backend_is_cpu  (model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
                ) {
                // for the CPU and Metal backend, we can read directly into the tensor
                fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
            } else {
                // read into a temporary buffer first, then copy to device memory
                read_buf.resize(ggml_nbytes(tensor));
                fin.read(read_buf.data(), ggml_nbytes(tensor));
                ggml_backend_tensor_set(tensor, read_buf.data(), 0, ggml_nbytes(tensor));
            }

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                //ggml_tallocr_alloc(alloc, model.lm_head);
                //ggml_backend_tensor_copy(tensor, model.lm_head);
                model.lm_head = tensor;
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}